

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionStamp.cpp
# Opt level: O2

void __thiscall OpenMD::TorsionStamp::TorsionStamp(TorsionStamp *this)

{
  allocator<char> local_71;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  char local_60 [8];
  undefined8 uStack_58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_50;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__TorsionStamp_002cb9d8;
  (this->GhostVectorSource).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->GhostVectorSource).super_ParameterBase.keyword_.field_2;
  (this->GhostVectorSource).super_ParameterBase.keyword_._M_string_length = 0;
  (this->GhostVectorSource).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->GhostVectorSource).super_ParameterBase.optional_ = false;
  (this->GhostVectorSource).super_ParameterBase.defaultValue_ = false;
  (this->GhostVectorSource).super_ParameterBase.empty_ = true;
  (this->GhostVectorSource).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002c8510;
  (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->orType_)._M_dataplus._M_p = (pointer)&(this->orType_).field_2;
  (this->orType_)._M_string_length = 0;
  (this->orType_).field_2._M_local_buf[0] = '\0';
  (this->orPars_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->orPars_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orPars_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"ghostVectorSource",(allocator<char> *)&local_70);
  std::__cxx11::string::_M_assign((string *)&(this->GhostVectorSource).super_ParameterBase.keyword_)
  ;
  std::__cxx11::string::~string((string *)&local_50);
  (this->GhostVectorSource).super_ParameterBase.optional_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"ghostVectorSource",&local_71);
  local_50.first._M_string_length = local_68;
  local_50.first._M_dataplus._M_p = (pointer)&local_50.first.field_2;
  if (local_70 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60) {
    local_50.first.field_2._8_8_ = uStack_58;
  }
  else {
    local_50.first._M_dataplus._M_p = (pointer)local_70;
  }
  local_68 = 0;
  local_60[0] = '\0';
  local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_60;
  local_50.second = &(this->GhostVectorSource).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)&(this->super_DataHolder).parameters_,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

TorsionStamp::TorsionStamp() : hasOverride_(false) {
    DefineOptionalParameter(GhostVectorSource, "ghostVectorSource");
  }